

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O0

string * __thiscall
flatbuffers::dart::DartGenerator::EnumSize_abi_cxx11_
          (string *__return_storage_ptr__,DartGenerator *this,Type *type)

{
  allocator<char> local_30;
  allocator<char> local_2f;
  allocator<char> local_2e;
  allocator<char> local_2d [20];
  allocator<char> local_19;
  DartGenerator *local_18;
  Type *type_local;
  
  local_18 = this;
  type_local = (Type *)__return_storage_ptr__;
  switch(*(undefined4 *)&(this->super_BaseGenerator)._vptr_BaseGenerator) {
  case 1:
  case 2:
  case 3:
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"1",&local_19);
    std::allocator<char>::~allocator(&local_19);
    break;
  case 5:
  case 6:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"2",local_2d);
    std::allocator<char>::~allocator(local_2d);
    break;
  case 7:
  case 8:
  case 0xb:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"4",&local_2e);
    std::allocator<char>::~allocator(&local_2e);
    break;
  case 9:
  case 10:
  case 0xc:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"8",&local_2f);
    std::allocator<char>::~allocator(&local_2f);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"1",&local_30);
    std::allocator<char>::~allocator(&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string EnumSize(const Type &type) {
    switch (type.base_type) {
      case BASE_TYPE_BOOL:
      case BASE_TYPE_CHAR:
      case BASE_TYPE_UTYPE:
      case BASE_TYPE_UCHAR: return "1";
      case BASE_TYPE_SHORT:
      case BASE_TYPE_USHORT: return "2";
      case BASE_TYPE_INT:
      case BASE_TYPE_UINT:
      case BASE_TYPE_FLOAT: return "4";
      case BASE_TYPE_LONG:
      case BASE_TYPE_ULONG:
      case BASE_TYPE_DOUBLE: return "8";
      default: return "1";
    }
  }